

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpki.c
# Opt level: O0

size_t bpkiPrivkeyEnc(octet *pki,octet *privkey,size_t privkey_len)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  long in_RDX;
  long in_RDI;
  size_t t_10;
  size_t t_9;
  size_t t_8;
  size_t t_7;
  size_t t_6;
  size_t t_5;
  size_t t_4;
  size_t t_3;
  size_t t_2;
  size_t t_1;
  size_t t;
  size_t count;
  der_anchor_t BignAlgId [1];
  der_anchor_t PKI [1];
  size_t in_stack_fffffffffffffee8;
  octet *in_stack_fffffffffffffef0;
  der_anchor_t *in_stack_fffffffffffffef8;
  char *in_stack_ffffffffffffff00;
  der_anchor_t *in_stack_ffffffffffffff08;
  der_anchor_t *in_stack_ffffffffffffff10;
  der_anchor_t *in_stack_ffffffffffffff18;
  undefined8 in_stack_ffffffffffffff20;
  u32 uVar6;
  octet *in_stack_ffffffffffffff28;
  long local_d0;
  long local_c8;
  long local_c0;
  long local_60;
  der_anchor_t *local_8;
  
  uVar6 = (u32)((ulong)in_stack_ffffffffffffff20 >> 0x20);
  sVar1 = derTSEQEncStart(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                          in_stack_fffffffffffffee8,0);
  if (in_RDI == 0) {
    local_c0 = 0;
  }
  else {
    local_c0 = in_RDI + sVar1;
  }
  sVar2 = derTSIZEEnc(in_stack_ffffffffffffff28,uVar6,(size_t)in_stack_ffffffffffffff18);
  if (local_c0 == 0) {
    local_c8 = 0;
  }
  else {
    local_c8 = local_c0 + sVar2;
  }
  sVar3 = derTSEQEncStart(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                          in_stack_fffffffffffffee8,0);
  if (local_c8 == 0) {
    local_d0 = 0;
  }
  else {
    local_d0 = local_c8 + sVar3;
  }
  sVar4 = derOIDEnc((octet *)in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  if (local_d0 == 0) {
    local_d0 = 0;
  }
  else {
    local_d0 = local_d0 + sVar4;
  }
  if (in_RDX == 0x18) {
    sVar5 = derOIDEnc((octet *)in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
    if (local_d0 == 0) {
      local_8 = (der_anchor_t *)0x0;
    }
    else {
      local_8 = (der_anchor_t *)(local_d0 + sVar5);
    }
  }
  else if (in_RDX == 0x20) {
    sVar5 = derOIDEnc((octet *)in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
    if (local_d0 == 0) {
      in_stack_ffffffffffffff18 = (der_anchor_t *)0x0;
      local_8 = in_stack_ffffffffffffff18;
    }
    else {
      in_stack_ffffffffffffff18 = (der_anchor_t *)(local_d0 + sVar5);
      local_8 = in_stack_ffffffffffffff18;
    }
  }
  else if (in_RDX == 0x30) {
    sVar5 = derOIDEnc((octet *)in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
    if (local_d0 == 0) {
      in_stack_ffffffffffffff10 = (der_anchor_t *)0x0;
      local_8 = in_stack_ffffffffffffff10;
    }
    else {
      in_stack_ffffffffffffff10 = (der_anchor_t *)(local_d0 + sVar5);
      local_8 = in_stack_ffffffffffffff10;
    }
  }
  else {
    sVar5 = derOIDEnc((octet *)in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
    if (local_d0 == 0) {
      in_stack_ffffffffffffff08 = (der_anchor_t *)0x0;
      local_8 = in_stack_ffffffffffffff08;
    }
    else {
      in_stack_ffffffffffffff08 = (der_anchor_t *)(local_d0 + sVar5);
      local_8 = in_stack_ffffffffffffff08;
    }
  }
  local_60 = sVar5 + sVar4 + sVar3 + sVar2 + sVar1;
  sVar1 = derTSEQEncStop((octet *)in_stack_ffffffffffffff18,(size_t)in_stack_ffffffffffffff10,
                         in_stack_ffffffffffffff08);
  if (local_8 == (der_anchor_t *)0x0) {
    uVar6 = 0;
  }
  else {
    uVar6 = (u32)((long)&local_8->der + sVar1 >> 0x20);
  }
  sVar2 = derEnc((octet *)in_stack_ffffffffffffff08,uVar6,in_stack_fffffffffffffef8,
                 (size_t)in_stack_fffffffffffffef0);
  sVar3 = derTSEQEncStop((octet *)in_stack_ffffffffffffff18,(size_t)in_stack_ffffffffffffff10,
                         in_stack_ffffffffffffff08);
  return sVar3 + sVar2 + sVar1 + local_60;
}

Assistant:

static size_t bpkiPrivkeyEnc(octet pki[], const octet privkey[],
	size_t privkey_len)
{
	der_anchor_t PKI[1];
	der_anchor_t BignAlgId[1];
	size_t count = 0;
	// проверить ключи
	ASSERT(privkey_len == 24 || privkey_len == 32 || privkey_len == 48 || 
		privkey_len == 64);
	ASSERT(memIsNullOrValid(privkey, privkey_len));
	// кодировать
	derEncStep(derSEQEncStart(PKI, pki, count), pki, count);
	 derEncStep(derSIZEEnc(pki, 0), pki, count);
	 derEncStep(derSEQEncStart(BignAlgId, pki, count), pki, count);
	  derEncStep(derOIDEnc(pki, oid_bign_pubkey), pki, count);
	  if (privkey_len == 24)
		  derEncStep(derOIDEnc(pki, oid_bign_curve192v1), pki, count);
	  else if (privkey_len == 32)
		  derEncStep(derOIDEnc(pki, oid_bign_curve256v1), pki, count);
	  else if (privkey_len == 48)
		  derEncStep(derOIDEnc(pki, oid_bign_curve384v1), pki, count);
	  else
		  derEncStep(derOIDEnc(pki, oid_bign_curve512v1), pki, count);
	 derEncStep(derSEQEncStop(pki, count, BignAlgId), pki, count);
	 derEncStep(derOCTEnc(pki, privkey, privkey_len), pki, count);
	derEncStep(derSEQEncStop(pki, count, PKI), pki, count);
	// возвратить длину DER-кода
	return count;
}